

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

void __thiscall QHttpNetworkConnectionPrivate::fillHttp2Queue(QHttpNetworkConnectionPrivate *this)

{
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *pQVar1;
  QHttpNetworkConnectionChannel *pQVar2;
  iterator iVar3;
  iterator iVar4;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *pair;
  long in_FS_OFFSET;
  Priority local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->highPriorityQueue;
  iVar3 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin(pQVar1);
  iVar4 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end(pQVar1);
  if (iVar3.i != iVar4.i) {
    do {
      if (*(char *)(*(long *)&(iVar3.i)->second->field_0x8 + 0x1b8) == '\0') {
        prepareRequest(this,iVar3.i);
      }
      local_3c = HighPriority;
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
                (&this->channels->h2RequestsToSend,(int *)&local_3c,iVar3.i);
      iVar3.i = iVar3.i + 1;
    } while (iVar3.i != iVar4.i);
  }
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear(pQVar1);
  pQVar1 = &this->lowPriorityQueue;
  iVar3 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin(pQVar1);
  iVar4 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end(pQVar1);
  if (iVar3.i != iVar4.i) {
    do {
      if (*(char *)(*(long *)&(iVar3.i)->second->field_0x8 + 0x1b8) == '\0') {
        prepareRequest(this,iVar3.i);
      }
      pQVar2 = this->channels;
      local_3c = QHttpNetworkRequest::priority(&(iVar3.i)->first);
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
                (&pQVar2->h2RequestsToSend,(int *)&local_3c,iVar3.i);
      iVar3.i = iVar3.i + 1;
    } while (iVar3.i != iVar4.i);
  }
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear(pQVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::fillHttp2Queue()
{
    for (auto &pair : highPriorityQueue) {
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(QHttpNetworkRequest::HighPriority, pair);
    }

    highPriorityQueue.clear();

    for (auto &pair : lowPriorityQueue) {
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(pair.first.priority(), pair);
    }

    lowPriorityQueue.clear();
}